

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O1

void ut::are_equal<agge::point<float>,2ul,agge::pod_vector<agge::point<float>>>
               (point<float> (*expected) [2],pod_vector<agge::point<float>_> *actual,
               LocationInfo *location)

{
  bool bVar1;
  FailedAssertion *pFVar2;
  string local_40;
  
  if ((long)actual->_end - (long)actual->_begin != 0x10) {
    pFVar2 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Values are not equal!","");
    FailedAssertion::FailedAssertion(pFVar2,&local_40,location);
    __cxa_throw(pFVar2,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
  }
  bVar1 = std::__equal<false>::equal<agge::point<float>*,agge::point<float>const*>
                    (*expected,expected[1],actual->_begin);
  if (bVar1) {
    return;
  }
  pFVar2 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Value is not \'true\'!","");
  FailedAssertion::FailedAssertion(pFVar2,&local_40,location);
  __cxa_throw(pFVar2,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}